

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

void sat_solver3_delete(sat_solver3 *s)

{
  int *piVar1;
  int **__ptr;
  veci *pvVar2;
  void *__ptr_00;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (s->Mem).nPagesAlloc;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      piVar1 = (s->Mem).pPages[lVar4];
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        (s->Mem).pPages[lVar4] = (int *)0x0;
        iVar3 = (s->Mem).nPagesAlloc;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  __ptr = (s->Mem).pPages;
  if (__ptr != (int **)0x0) {
    free(__ptr);
    (s->Mem).pPages = (int **)0x0;
  }
  piVar1 = (s->order).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->order).ptr = (int *)0x0;
  }
  piVar1 = (s->trail_lim).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->trail_lim).ptr = (int *)0x0;
  }
  piVar1 = (s->tagged).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->tagged).ptr = (int *)0x0;
  }
  piVar1 = (s->act_clas).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->act_clas).ptr = (int *)0x0;
  }
  piVar1 = (s->stack).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->stack).ptr = (int *)0x0;
  }
  piVar1 = (s->act_vars).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->act_vars).ptr = (int *)0x0;
  }
  piVar1 = (s->unit_lits).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->unit_lits).ptr = (int *)0x0;
  }
  piVar1 = (s->pivot_vars).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->pivot_vars).ptr = (int *)0x0;
  }
  piVar1 = (s->temp_clause).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->temp_clause).ptr = (int *)0x0;
  }
  piVar1 = (s->conf_final).ptr;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->conf_final).ptr = (int *)0x0;
  }
  if (s->reasons != (int *)0x0) {
    iVar3 = s->cap;
    if (0 < iVar3) {
      lVar4 = 8;
      lVar5 = 0;
      do {
        pvVar2 = s->wlists;
        __ptr_00 = *(void **)((long)&pvVar2->cap + lVar4);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&pvVar2->cap + lVar4) = 0;
          iVar3 = s->cap;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < iVar3 * 2);
    }
    if (s->wlists != (veci *)0x0) {
      free(s->wlists);
      s->wlists = (veci *)0x0;
    }
    if (s->levels != (int *)0x0) {
      free(s->levels);
      s->levels = (int *)0x0;
    }
    if (s->assigns != (char *)0x0) {
      free(s->assigns);
      s->assigns = (char *)0x0;
    }
    if (s->polarity != (char *)0x0) {
      free(s->polarity);
      s->polarity = (char *)0x0;
    }
    if (s->tags != (char *)0x0) {
      free(s->tags);
      s->tags = (char *)0x0;
    }
    if (s->loads != (char *)0x0) {
      free(s->loads);
      s->loads = (char *)0x0;
    }
    if (s->activity != (word *)0x0) {
      free(s->activity);
      s->activity = (word *)0x0;
    }
    if (s->activity2 != (word *)0x0) {
      free(s->activity2);
      s->activity2 = (word *)0x0;
    }
    if (s->pFreqs != (char *)0x0) {
      free(s->pFreqs);
      s->pFreqs = (char *)0x0;
    }
    if (s->factors != (double *)0x0) {
      free(s->factors);
      s->factors = (double *)0x0;
    }
    if (s->orderpos != (int *)0x0) {
      free(s->orderpos);
      s->orderpos = (int *)0x0;
    }
    if (s->reasons != (int *)0x0) {
      free(s->reasons);
      s->reasons = (int *)0x0;
    }
    if (s->trail != (lit *)0x0) {
      free(s->trail);
      s->trail = (lit *)0x0;
    }
    if (s->model != (int *)0x0) {
      free(s->model);
    }
  }
  free(s);
  return;
}

Assistant:

void sat_solver3_delete(sat_solver3* s)
{
//    Vec_SetFree_( &s->Mem );
    Sat_MemFree_( &s->Mem );

    // delete vectors
    veci_delete(&s->order);
    veci_delete(&s->trail_lim);
    veci_delete(&s->tagged);
//    veci_delete(&s->learned);
    veci_delete(&s->act_clas);
    veci_delete(&s->stack);
//    veci_delete(&s->model);
    veci_delete(&s->act_vars);
    veci_delete(&s->unit_lits);
    veci_delete(&s->pivot_vars);
    veci_delete(&s->temp_clause);
    veci_delete(&s->conf_final);

    // delete arrays
    if (s->reasons != 0){
        int i;
        for (i = 0; i < s->cap*2; i++)
            veci_delete(&s->wlists[i]);
        ABC_FREE(s->wlists   );
//        ABC_FREE(s->vi       );
        ABC_FREE(s->levels   );
        ABC_FREE(s->assigns  );
        ABC_FREE(s->polarity );
        ABC_FREE(s->tags     );
        ABC_FREE(s->loads    );
        ABC_FREE(s->activity );
        ABC_FREE(s->activity2);
        ABC_FREE(s->pFreqs   );
        ABC_FREE(s->factors  );
        ABC_FREE(s->orderpos );
        ABC_FREE(s->reasons  );
        ABC_FREE(s->trail    );
        ABC_FREE(s->model    );
    }

    ABC_FREE(s);
}